

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerAddPageToRollbackJournal(PgHdr *pPg)

{
  Pgno PVar1;
  void *pvVar2;
  Pager *pPager;
  long lVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  u32 uVar7;
  long in_FS_OFFSET;
  undefined1 local_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = pPg->pData;
  pPager = pPg->pPager;
  lVar3 = pPager->journalOff;
  uVar7 = pPager->cksumInit;
  uVar4 = (int)pPager->pageSize - 200;
  if (0 < (int)uVar4) {
    lVar6 = (ulong)uVar4 + 200;
    do {
      uVar7 = uVar7 + *(byte *)((long)pvVar2 + lVar6 + -200);
      lVar6 = lVar6 + -200;
    } while (200 < lVar6);
  }
  *(byte *)&pPg->flags = (byte)pPg->flags | 8;
  PVar1 = pPg->pgno;
  _local_3c = CONCAT11((char)(PVar1 >> 0x10),(char)(PVar1 >> 0x18));
  _local_3c = CONCAT12((char)(PVar1 >> 8),_local_3c);
  _local_3c = CONCAT13((char)PVar1,_local_3c);
  uVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_3c,4,lVar3);
  if (uVar4 == 0) {
    uVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,pvVar2,(int)pPager->pageSize,lVar3 + 4);
    if (uVar4 == 0) {
      _local_3c = CONCAT11((char)(uVar7 >> 0x10),(char)(uVar7 >> 0x18));
      _local_3c = CONCAT12((char)(uVar7 >> 8),_local_3c);
      _local_3c = CONCAT13((char)uVar7,_local_3c);
      uVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_3c,4,lVar3 + pPager->pageSize + 4)
      ;
      if (uVar4 == 0) {
        pPager->journalOff = pPager->pageSize + pPager->journalOff + 8;
        pPager->nRec = pPager->nRec + 1;
        uVar5 = sqlite3BitvecSet(pPager->pInJournal,pPg->pgno);
        uVar4 = addToSavepointBitvecs(pPager,pPg->pgno);
        uVar4 = uVar4 | uVar5;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE int pagerAddPageToRollbackJournal(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  int rc;
  u32 cksum;
  char *pData2;
  i64 iOff = pPager->journalOff;

  /* We should never write to the journal file the page that
  ** contains the database locks.  The following assert verifies
  ** that we do not. */
  assert( pPg->pgno!=PAGER_SJ_PGNO(pPager) );

  assert( pPager->journalHdr<=pPager->journalOff );
  pData2 = pPg->pData;
  cksum = pager_cksum(pPager, (u8*)pData2);

  /* Even if an IO or diskfull error occurs while journalling the
  ** page in the block above, set the need-sync flag for the page.
  ** Otherwise, when the transaction is rolled back, the logic in
  ** playback_one_page() will think that the page needs to be restored
  ** in the database file. And if an IO error occurs while doing so,
  ** then corruption may follow.
  */
  pPg->flags |= PGHDR_NEED_SYNC;

  rc = write32bits(pPager->jfd, iOff, pPg->pgno);
  if( rc!=SQLITE_OK ) return rc;
  rc = sqlite3OsWrite(pPager->jfd, pData2, pPager->pageSize, iOff+4);
  if( rc!=SQLITE_OK ) return rc;
  rc = write32bits(pPager->jfd, iOff+pPager->pageSize+4, cksum);
  if( rc!=SQLITE_OK ) return rc;

  IOTRACE(("JOUT %p %d %lld %d\n", pPager, pPg->pgno,
           pPager->journalOff, pPager->pageSize));
  PAGER_INCR(sqlite3_pager_writej_count);
  PAGERTRACE(("JOURNAL %d page %d needSync=%d hash(%08x)\n",
       PAGERID(pPager), pPg->pgno,
       ((pPg->flags&PGHDR_NEED_SYNC)?1:0), pager_pagehash(pPg)));

  pPager->journalOff += 8 + pPager->pageSize;
  pPager->nRec++;
  assert( pPager->pInJournal!=0 );
  rc = sqlite3BitvecSet(pPager->pInJournal, pPg->pgno);
  testcase( rc==SQLITE_NOMEM );
  assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
  rc |= addToSavepointBitvecs(pPager, pPg->pgno);
  assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
  return rc;
}